

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Date *d)

{
  int iVar1;
  ostream *poVar2;
  Date *d_local;
  ostream *os_local;
  
  poVar2 = std::operator<<(os,'(');
  iVar1 = Date::year(d);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,',');
  iVar1 = Date::month(d);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,',');
  iVar1 = Date::day(d);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,')');
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Date& d)
{
	return os << '(' << d.year()
		<< ',' << d.month()
		<< ',' << d.day() << ')';
}